

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jedi.cpp
# Opt level: O3

int drawDisplayStringList(void)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  int iVar50;
  uint uVar51;
  int y;
  ulong uVar52;
  uint8_t *puVar53;
  uint8_t *puVar54;
  long lVar55;
  ulong uVar56;
  char *c;
  char *pcVar57;
  undefined1 auVar58 [16];
  long lVar59;
  undefined1 in_XMM1 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  int iVar79;
  int iVar82;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  long lVar81;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  int iVar80;
  int iVar83;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  int iVar138;
  int iVar139;
  int iVar146;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  int iVar147;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  long lVar89;
  
  drawMap();
  iVar50 = display_string_list_line_count;
  auVar49 = _DAT_00149470;
  iVar80 = display_string_list_line_count * 6;
  y = display_string_list_line_count * -6 + 0x40 >> 1;
  iVar83 = display_string_list_line_count * 6;
  uVar51 = display_string_list_line_count * 6 + 4;
  auVar58._4_4_ = 0;
  auVar58._0_4_ = uVar51;
  auVar58._8_4_ = uVar51;
  auVar58._12_4_ = 0;
  puVar53 = jedi_screen_buffer + (long)y * 0x80 + 0x683;
  lVar55 = 0;
  do {
    if (-1 < iVar50) {
      uVar56 = 0;
      auVar87 = _DAT_001494b0;
      auVar90 = _DAT_001494c0;
      auVar92 = _DAT_001494d0;
      auVar94 = _DAT_001494e0;
      auVar148 = _DAT_00149460;
      auVar150 = _DAT_00149510;
      auVar152 = _DAT_00149500;
      auVar69 = _DAT_001494f0;
      do {
        auVar84 = auVar58 ^ auVar49;
        auVar113 = auVar148 ^ auVar49;
        iVar79 = auVar84._0_4_;
        iVar138 = -(uint)(iVar79 < auVar113._0_4_);
        iVar82 = auVar84._4_4_;
        auVar115._4_4_ = -(uint)(iVar82 < auVar113._4_4_);
        iVar139 = auVar84._8_4_;
        iVar146 = -(uint)(iVar139 < auVar113._8_4_);
        iVar147 = auVar84._12_4_;
        auVar115._12_4_ = -(uint)(iVar147 < auVar113._12_4_);
        auVar84._4_4_ = iVar138;
        auVar84._0_4_ = iVar138;
        auVar84._8_4_ = iVar146;
        auVar84._12_4_ = iVar146;
        auVar96 = pshuflw(in_XMM7,auVar84,0xe8);
        auVar114._4_4_ = -(uint)(auVar113._4_4_ == iVar82);
        auVar114._12_4_ = -(uint)(auVar113._12_4_ == iVar147);
        auVar114._0_4_ = auVar114._4_4_;
        auVar114._8_4_ = auVar114._12_4_;
        auVar84 = pshuflw(in_XMM1,auVar114,0xe8);
        auVar115._0_4_ = auVar115._4_4_;
        auVar115._8_4_ = auVar115._12_4_;
        auVar97 = pshuflw(auVar96,auVar115,0xe8);
        auVar113._8_4_ = 0xffffffff;
        auVar113._0_8_ = 0xffffffffffffffff;
        auVar113._12_4_ = 0xffffffff;
        auVar113 = (auVar97 | auVar84 & auVar96) ^ auVar113;
        auVar84 = packssdw(auVar113,auVar113);
        if ((auVar84 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          puVar53[uVar56 - 0x780] = 0xff;
        }
        auVar96._4_4_ = iVar138;
        auVar96._0_4_ = iVar138;
        auVar96._8_4_ = iVar146;
        auVar96._12_4_ = iVar146;
        auVar115 = auVar114 & auVar96 | auVar115;
        auVar84 = packssdw(auVar115,auVar115);
        auVar97._8_4_ = 0xffffffff;
        auVar97._0_8_ = 0xffffffffffffffff;
        auVar97._12_4_ = 0xffffffff;
        auVar84 = packssdw(auVar84 ^ auVar97,auVar84 ^ auVar97);
        auVar84 = packsswb(auVar84,auVar84);
        if ((auVar84._0_4_ >> 8 & 1) != 0) {
          puVar53[uVar56 - 0x700] = 0xff;
        }
        auVar84 = auVar150 ^ auVar49;
        auVar98._0_4_ = -(uint)(iVar79 < auVar84._0_4_);
        auVar98._4_4_ = -(uint)(iVar82 < auVar84._4_4_);
        auVar98._8_4_ = -(uint)(iVar139 < auVar84._8_4_);
        auVar98._12_4_ = -(uint)(iVar147 < auVar84._12_4_);
        auVar116._4_4_ = auVar98._0_4_;
        auVar116._0_4_ = auVar98._0_4_;
        auVar116._8_4_ = auVar98._8_4_;
        auVar116._12_4_ = auVar98._8_4_;
        iVar138 = -(uint)(auVar84._4_4_ == iVar82);
        iVar146 = -(uint)(auVar84._12_4_ == iVar147);
        auVar2._4_4_ = iVar138;
        auVar2._0_4_ = iVar138;
        auVar2._8_4_ = iVar146;
        auVar2._12_4_ = iVar146;
        auVar140._4_4_ = auVar98._4_4_;
        auVar140._0_4_ = auVar98._4_4_;
        auVar140._8_4_ = auVar98._12_4_;
        auVar140._12_4_ = auVar98._12_4_;
        auVar84 = auVar2 & auVar116 | auVar140;
        auVar84 = packssdw(auVar84,auVar84);
        auVar30._8_4_ = 0xffffffff;
        auVar30._0_8_ = 0xffffffffffffffff;
        auVar30._12_4_ = 0xffffffff;
        auVar84 = packssdw(auVar84 ^ auVar30,auVar84 ^ auVar30);
        auVar84 = packsswb(auVar84,auVar84);
        if ((auVar84._0_4_ >> 0x10 & 1) != 0) {
          puVar53[uVar56 - 0x680] = 0xff;
        }
        auVar84 = pshufhw(auVar84,auVar116,0x84);
        auVar3._4_4_ = iVar138;
        auVar3._0_4_ = iVar138;
        auVar3._8_4_ = iVar146;
        auVar3._12_4_ = iVar146;
        auVar96 = pshufhw(auVar98,auVar3,0x84);
        auVar113 = pshufhw(auVar84,auVar140,0x84);
        auVar60._8_4_ = 0xffffffff;
        auVar60._0_8_ = 0xffffffffffffffff;
        auVar60._12_4_ = 0xffffffff;
        auVar60 = (auVar113 | auVar96 & auVar84) ^ auVar60;
        auVar84 = packssdw(auVar60,auVar60);
        auVar84 = packsswb(auVar84,auVar84);
        if ((auVar84._0_4_ >> 0x18 & 1) != 0) {
          puVar53[uVar56 - 0x600] = 0xff;
        }
        auVar84 = auVar152 ^ auVar49;
        auVar99._0_4_ = -(uint)(iVar79 < auVar84._0_4_);
        auVar99._4_4_ = -(uint)(iVar82 < auVar84._4_4_);
        auVar99._8_4_ = -(uint)(iVar139 < auVar84._8_4_);
        auVar99._12_4_ = -(uint)(iVar147 < auVar84._12_4_);
        auVar4._4_4_ = auVar99._0_4_;
        auVar4._0_4_ = auVar99._0_4_;
        auVar4._8_4_ = auVar99._8_4_;
        auVar4._12_4_ = auVar99._8_4_;
        auVar96 = pshuflw(auVar140,auVar4,0xe8);
        auVar61._0_4_ = -(uint)(auVar84._0_4_ == iVar79);
        auVar61._4_4_ = -(uint)(auVar84._4_4_ == iVar82);
        auVar61._8_4_ = -(uint)(auVar84._8_4_ == iVar139);
        auVar61._12_4_ = -(uint)(auVar84._12_4_ == iVar147);
        auVar117._4_4_ = auVar61._4_4_;
        auVar117._0_4_ = auVar61._4_4_;
        auVar117._8_4_ = auVar61._12_4_;
        auVar117._12_4_ = auVar61._12_4_;
        auVar84 = pshuflw(auVar61,auVar117,0xe8);
        auVar118._4_4_ = auVar99._4_4_;
        auVar118._0_4_ = auVar99._4_4_;
        auVar118._8_4_ = auVar99._12_4_;
        auVar118._12_4_ = auVar99._12_4_;
        auVar113 = pshuflw(auVar99,auVar118,0xe8);
        auVar31._8_4_ = 0xffffffff;
        auVar31._0_8_ = 0xffffffffffffffff;
        auVar31._12_4_ = 0xffffffff;
        auVar84 = packssdw(auVar84 & auVar96,(auVar113 | auVar84 & auVar96) ^ auVar31);
        auVar84 = packsswb(auVar84,auVar84);
        if ((auVar84 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          puVar53[uVar56 - 0x580] = 0xff;
        }
        auVar5._4_4_ = auVar99._0_4_;
        auVar5._0_4_ = auVar99._0_4_;
        auVar5._8_4_ = auVar99._8_4_;
        auVar5._12_4_ = auVar99._8_4_;
        auVar118 = auVar117 & auVar5 | auVar118;
        auVar113 = packssdw(auVar118,auVar118);
        auVar32._8_4_ = 0xffffffff;
        auVar32._0_8_ = 0xffffffffffffffff;
        auVar32._12_4_ = 0xffffffff;
        auVar84 = packssdw(auVar84,auVar113 ^ auVar32);
        auVar84 = packsswb(auVar84,auVar84);
        if ((auVar84._4_2_ >> 8 & 1) != 0) {
          puVar53[uVar56 - 0x500] = 0xff;
        }
        auVar84 = auVar69 ^ auVar49;
        auVar100._0_4_ = -(uint)(iVar79 < auVar84._0_4_);
        auVar100._4_4_ = -(uint)(iVar82 < auVar84._4_4_);
        auVar100._8_4_ = -(uint)(iVar139 < auVar84._8_4_);
        auVar100._12_4_ = -(uint)(iVar147 < auVar84._12_4_);
        auVar119._4_4_ = auVar100._0_4_;
        auVar119._0_4_ = auVar100._0_4_;
        auVar119._8_4_ = auVar100._8_4_;
        auVar119._12_4_ = auVar100._8_4_;
        iVar138 = -(uint)(auVar84._4_4_ == iVar82);
        iVar146 = -(uint)(auVar84._12_4_ == iVar147);
        auVar6._4_4_ = iVar138;
        auVar6._0_4_ = iVar138;
        auVar6._8_4_ = iVar146;
        auVar6._12_4_ = iVar146;
        auVar141._4_4_ = auVar100._4_4_;
        auVar141._0_4_ = auVar100._4_4_;
        auVar141._8_4_ = auVar100._12_4_;
        auVar141._12_4_ = auVar100._12_4_;
        auVar84 = auVar6 & auVar119 | auVar141;
        auVar84 = packssdw(auVar84,auVar84);
        auVar33._8_4_ = 0xffffffff;
        auVar33._0_8_ = 0xffffffffffffffff;
        auVar33._12_4_ = 0xffffffff;
        auVar84 = packssdw(auVar84 ^ auVar33,auVar84 ^ auVar33);
        auVar84 = packsswb(auVar84,auVar84);
        if ((auVar84 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          puVar53[uVar56 - 0x480] = 0xff;
        }
        auVar84 = pshufhw(auVar84,auVar119,0x84);
        auVar7._4_4_ = iVar138;
        auVar7._0_4_ = iVar138;
        auVar7._8_4_ = iVar146;
        auVar7._12_4_ = iVar146;
        auVar96 = pshufhw(auVar100,auVar7,0x84);
        auVar113 = pshufhw(auVar84,auVar141,0x84);
        auVar62._8_4_ = 0xffffffff;
        auVar62._0_8_ = 0xffffffffffffffff;
        auVar62._12_4_ = 0xffffffff;
        auVar62 = (auVar113 | auVar96 & auVar84) ^ auVar62;
        auVar84 = packssdw(auVar62,auVar62);
        auVar84 = packsswb(auVar84,auVar84);
        if ((auVar84._6_2_ >> 8 & 1) != 0) {
          puVar53[uVar56 - 0x400] = 0xff;
        }
        auVar84 = auVar94 ^ auVar49;
        auVar101._0_4_ = -(uint)(iVar79 < auVar84._0_4_);
        auVar101._4_4_ = -(uint)(iVar82 < auVar84._4_4_);
        auVar101._8_4_ = -(uint)(iVar139 < auVar84._8_4_);
        auVar101._12_4_ = -(uint)(iVar147 < auVar84._12_4_);
        auVar8._4_4_ = auVar101._0_4_;
        auVar8._0_4_ = auVar101._0_4_;
        auVar8._8_4_ = auVar101._8_4_;
        auVar8._12_4_ = auVar101._8_4_;
        auVar96 = pshuflw(auVar141,auVar8,0xe8);
        auVar63._0_4_ = -(uint)(auVar84._0_4_ == iVar79);
        auVar63._4_4_ = -(uint)(auVar84._4_4_ == iVar82);
        auVar63._8_4_ = -(uint)(auVar84._8_4_ == iVar139);
        auVar63._12_4_ = -(uint)(auVar84._12_4_ == iVar147);
        auVar120._4_4_ = auVar63._4_4_;
        auVar120._0_4_ = auVar63._4_4_;
        auVar120._8_4_ = auVar63._12_4_;
        auVar120._12_4_ = auVar63._12_4_;
        auVar84 = pshuflw(auVar63,auVar120,0xe8);
        auVar121._4_4_ = auVar101._4_4_;
        auVar121._0_4_ = auVar101._4_4_;
        auVar121._8_4_ = auVar101._12_4_;
        auVar121._12_4_ = auVar101._12_4_;
        auVar113 = pshuflw(auVar101,auVar121,0xe8);
        auVar102._8_4_ = 0xffffffff;
        auVar102._0_8_ = 0xffffffffffffffff;
        auVar102._12_4_ = 0xffffffff;
        auVar102 = (auVar113 | auVar84 & auVar96) ^ auVar102;
        auVar113 = packssdw(auVar102,auVar102);
        auVar84 = packsswb(auVar84 & auVar96,auVar113);
        if ((auVar84 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          puVar53[uVar56 - 0x380] = 0xff;
        }
        auVar9._4_4_ = auVar101._0_4_;
        auVar9._0_4_ = auVar101._0_4_;
        auVar9._8_4_ = auVar101._8_4_;
        auVar9._12_4_ = auVar101._8_4_;
        auVar121 = auVar120 & auVar9 | auVar121;
        auVar113 = packssdw(auVar121,auVar121);
        auVar34._8_4_ = 0xffffffff;
        auVar34._0_8_ = 0xffffffffffffffff;
        auVar34._12_4_ = 0xffffffff;
        auVar113 = packssdw(auVar113 ^ auVar34,auVar113 ^ auVar34);
        auVar84 = packsswb(auVar84,auVar113);
        if ((auVar84._8_2_ >> 8 & 1) != 0) {
          puVar53[uVar56 - 0x300] = 0xff;
        }
        auVar84 = auVar92 ^ auVar49;
        auVar103._0_4_ = -(uint)(iVar79 < auVar84._0_4_);
        auVar103._4_4_ = -(uint)(iVar82 < auVar84._4_4_);
        auVar103._8_4_ = -(uint)(iVar139 < auVar84._8_4_);
        auVar103._12_4_ = -(uint)(iVar147 < auVar84._12_4_);
        auVar122._4_4_ = auVar103._0_4_;
        auVar122._0_4_ = auVar103._0_4_;
        auVar122._8_4_ = auVar103._8_4_;
        auVar122._12_4_ = auVar103._8_4_;
        iVar138 = -(uint)(auVar84._4_4_ == iVar82);
        iVar146 = -(uint)(auVar84._12_4_ == iVar147);
        auVar10._4_4_ = iVar138;
        auVar10._0_4_ = iVar138;
        auVar10._8_4_ = iVar146;
        auVar10._12_4_ = iVar146;
        auVar142._4_4_ = auVar103._4_4_;
        auVar142._0_4_ = auVar103._4_4_;
        auVar142._8_4_ = auVar103._12_4_;
        auVar142._12_4_ = auVar103._12_4_;
        auVar84 = auVar10 & auVar122 | auVar142;
        auVar84 = packssdw(auVar84,auVar84);
        auVar35._8_4_ = 0xffffffff;
        auVar35._0_8_ = 0xffffffffffffffff;
        auVar35._12_4_ = 0xffffffff;
        auVar84 = packssdw(auVar84 ^ auVar35,auVar84 ^ auVar35);
        auVar84 = packsswb(auVar84,auVar84);
        if ((auVar84 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          puVar53[uVar56 - 0x280] = 0xff;
        }
        auVar84 = pshufhw(auVar84,auVar122,0x84);
        auVar11._4_4_ = iVar138;
        auVar11._0_4_ = iVar138;
        auVar11._8_4_ = iVar146;
        auVar11._12_4_ = iVar146;
        auVar96 = pshufhw(auVar103,auVar11,0x84);
        auVar113 = pshufhw(auVar84,auVar142,0x84);
        auVar64._8_4_ = 0xffffffff;
        auVar64._0_8_ = 0xffffffffffffffff;
        auVar64._12_4_ = 0xffffffff;
        auVar64 = (auVar113 | auVar96 & auVar84) ^ auVar64;
        auVar84 = packssdw(auVar64,auVar64);
        auVar84 = packsswb(auVar84,auVar84);
        if ((auVar84._10_2_ >> 8 & 1) != 0) {
          puVar53[uVar56 - 0x200] = 0xff;
        }
        auVar84 = auVar90 ^ auVar49;
        auVar104._0_4_ = -(uint)(iVar79 < auVar84._0_4_);
        auVar104._4_4_ = -(uint)(iVar82 < auVar84._4_4_);
        auVar104._8_4_ = -(uint)(iVar139 < auVar84._8_4_);
        auVar104._12_4_ = -(uint)(iVar147 < auVar84._12_4_);
        auVar12._4_4_ = auVar104._0_4_;
        auVar12._0_4_ = auVar104._0_4_;
        auVar12._8_4_ = auVar104._8_4_;
        auVar12._12_4_ = auVar104._8_4_;
        auVar96 = pshuflw(auVar142,auVar12,0xe8);
        auVar65._0_4_ = -(uint)(auVar84._0_4_ == iVar79);
        auVar65._4_4_ = -(uint)(auVar84._4_4_ == iVar82);
        auVar65._8_4_ = -(uint)(auVar84._8_4_ == iVar139);
        auVar65._12_4_ = -(uint)(auVar84._12_4_ == iVar147);
        auVar123._4_4_ = auVar65._4_4_;
        auVar123._0_4_ = auVar65._4_4_;
        auVar123._8_4_ = auVar65._12_4_;
        auVar123._12_4_ = auVar65._12_4_;
        auVar84 = pshuflw(auVar65,auVar123,0xe8);
        auVar124._4_4_ = auVar104._4_4_;
        auVar124._0_4_ = auVar104._4_4_;
        auVar124._8_4_ = auVar104._12_4_;
        auVar124._12_4_ = auVar104._12_4_;
        auVar113 = pshuflw(auVar104,auVar124,0xe8);
        auVar36._8_4_ = 0xffffffff;
        auVar36._0_8_ = 0xffffffffffffffff;
        auVar36._12_4_ = 0xffffffff;
        auVar84 = packssdw(auVar84 & auVar96,(auVar113 | auVar84 & auVar96) ^ auVar36);
        auVar84 = packsswb(auVar84,auVar84);
        if ((auVar84 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          puVar53[uVar56 - 0x180] = 0xff;
        }
        auVar13._4_4_ = auVar104._0_4_;
        auVar13._0_4_ = auVar104._0_4_;
        auVar13._8_4_ = auVar104._8_4_;
        auVar13._12_4_ = auVar104._8_4_;
        auVar124 = auVar123 & auVar13 | auVar124;
        auVar113 = packssdw(auVar124,auVar124);
        auVar37._8_4_ = 0xffffffff;
        auVar37._0_8_ = 0xffffffffffffffff;
        auVar37._12_4_ = 0xffffffff;
        auVar84 = packssdw(auVar84,auVar113 ^ auVar37);
        auVar84 = packsswb(auVar84,auVar84);
        if ((auVar84._12_2_ >> 8 & 1) != 0) {
          puVar53[uVar56 - 0x100] = 0xff;
        }
        auVar84 = auVar87 ^ auVar49;
        in_XMM7._0_4_ = -(uint)(iVar79 < auVar84._0_4_);
        in_XMM7._4_4_ = -(uint)(iVar82 < auVar84._4_4_);
        in_XMM7._8_4_ = -(uint)(iVar139 < auVar84._8_4_);
        in_XMM7._12_4_ = -(uint)(iVar147 < auVar84._12_4_);
        auVar125._4_4_ = in_XMM7._0_4_;
        auVar125._0_4_ = in_XMM7._0_4_;
        auVar125._8_4_ = in_XMM7._8_4_;
        auVar125._12_4_ = in_XMM7._8_4_;
        iVar79 = -(uint)(auVar84._4_4_ == iVar82);
        iVar82 = -(uint)(auVar84._12_4_ == iVar147);
        auVar85._4_4_ = iVar79;
        auVar85._0_4_ = iVar79;
        auVar85._8_4_ = iVar82;
        auVar85._12_4_ = iVar82;
        auVar66._4_4_ = in_XMM7._4_4_;
        auVar66._0_4_ = in_XMM7._4_4_;
        auVar66._8_4_ = in_XMM7._12_4_;
        auVar66._12_4_ = in_XMM7._12_4_;
        auVar66 = auVar85 & auVar125 | auVar66;
        auVar84 = packssdw(auVar66,auVar66);
        auVar38._8_4_ = 0xffffffff;
        auVar38._0_8_ = 0xffffffffffffffff;
        auVar38._12_4_ = 0xffffffff;
        auVar84 = packssdw(auVar84 ^ auVar38,auVar84 ^ auVar38);
        auVar84 = packsswb(auVar84,auVar84);
        if ((auVar84 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          puVar53[uVar56 - 0x80] = 0xff;
        }
        auVar84 = pshufhw(auVar84,auVar125,0x84);
        auVar96 = pshufhw(auVar85,auVar85,0x84);
        auVar14._4_4_ = in_XMM7._4_4_;
        auVar14._0_4_ = in_XMM7._4_4_;
        auVar14._8_4_ = in_XMM7._12_4_;
        auVar14._12_4_ = in_XMM7._12_4_;
        auVar113 = pshufhw(auVar84,auVar14,0x84);
        auVar67._8_4_ = 0xffffffff;
        auVar67._0_8_ = 0xffffffffffffffff;
        auVar67._12_4_ = 0xffffffff;
        auVar67 = (auVar113 | auVar96 & auVar84) ^ auVar67;
        auVar84 = packssdw(auVar67,auVar67);
        auVar84 = packsswb(auVar84,auVar84);
        if ((auVar84._14_2_ >> 8 & 1) != 0) {
          puVar53[uVar56] = 0xff;
        }
        lVar59 = (long)DAT_00149520;
        lVar89 = auVar148._8_8_;
        auVar148._0_8_ = auVar148._0_8_ + lVar59;
        lVar81 = DAT_00149520._8_8_;
        auVar148._8_8_ = lVar89 + lVar81;
        lVar89 = auVar150._8_8_;
        auVar150._0_8_ = auVar150._0_8_ + lVar59;
        auVar150._8_8_ = lVar89 + lVar81;
        lVar89 = auVar152._8_8_;
        auVar152._0_8_ = auVar152._0_8_ + lVar59;
        auVar152._8_8_ = lVar89 + lVar81;
        lVar89 = auVar69._8_8_;
        auVar69._0_8_ = auVar69._0_8_ + lVar59;
        auVar69._8_8_ = lVar89 + lVar81;
        lVar89 = auVar94._8_8_;
        auVar94._0_8_ = auVar94._0_8_ + lVar59;
        auVar94._8_8_ = lVar89 + lVar81;
        lVar89 = auVar92._8_8_;
        auVar92._0_8_ = auVar92._0_8_ + lVar59;
        auVar92._8_8_ = lVar89 + lVar81;
        lVar89 = auVar90._8_8_;
        auVar90._0_8_ = auVar90._0_8_ + lVar59;
        auVar90._8_8_ = lVar89 + lVar81;
        lVar89 = auVar87._8_8_;
        auVar87._0_8_ = auVar87._0_8_ + lVar59;
        auVar87._8_8_ = lVar89 + lVar81;
        uVar56 = uVar56 + 0x800;
        in_XMM1 = _DAT_00149520;
      } while (((ulong)(iVar83 + 5) * 0x80 + 0x780 & 0xfffffffffffff800) != uVar56);
    }
    lVar55 = lVar55 + 1;
    puVar53 = puVar53 + 1;
  } while (lVar55 != 0x7c);
  uVar56 = (ulong)(iVar80 + 2);
  lVar55 = uVar56 - 1;
  auVar68._8_4_ = (int)lVar55;
  auVar68._0_8_ = lVar55;
  auVar68._12_4_ = (int)((ulong)lVar55 >> 0x20);
  puVar53 = jedi_screen_buffer + (long)y * 0x80 + 0x704;
  lVar55 = 0;
  do {
    uVar52 = uVar56 + 0xf & 0xfffffffffffffff0;
    puVar54 = puVar53;
    auVar58 = _DAT_001494b0;
    auVar87 = _DAT_001494c0;
    auVar90 = _DAT_001494d0;
    auVar92 = _DAT_001494e0;
    auVar94 = _DAT_00149460;
    auVar148 = _DAT_00149510;
    auVar150 = _DAT_00149500;
    auVar152 = _DAT_001494f0;
    if (-1 < iVar50) {
      do {
        auVar84 = auVar68 ^ auVar49;
        auVar69 = auVar94 ^ auVar49;
        iVar80 = auVar84._0_4_;
        iVar139 = -(uint)(iVar80 < auVar69._0_4_);
        iVar83 = auVar84._4_4_;
        auVar127._4_4_ = -(uint)(iVar83 < auVar69._4_4_);
        iVar79 = auVar84._8_4_;
        iVar147 = -(uint)(iVar79 < auVar69._8_4_);
        iVar82 = auVar84._12_4_;
        auVar127._12_4_ = -(uint)(iVar82 < auVar69._12_4_);
        auVar15._4_4_ = iVar139;
        auVar15._0_4_ = iVar139;
        auVar15._8_4_ = iVar147;
        auVar15._12_4_ = iVar147;
        auVar84 = pshuflw(in_XMM7,auVar15,0xe8);
        auVar70._0_4_ = -(uint)(auVar69._0_4_ == iVar80);
        auVar70._4_4_ = -(uint)(auVar69._4_4_ == iVar83);
        auVar70._8_4_ = -(uint)(auVar69._8_4_ == iVar79);
        auVar70._12_4_ = -(uint)(auVar69._12_4_ == iVar82);
        auVar126._4_4_ = auVar70._4_4_;
        auVar126._0_4_ = auVar70._4_4_;
        auVar126._8_4_ = auVar70._12_4_;
        auVar126._12_4_ = auVar70._12_4_;
        auVar69 = pshuflw(auVar70,auVar126,0xe8);
        auVar127._0_4_ = auVar127._4_4_;
        auVar127._8_4_ = auVar127._12_4_;
        auVar113 = pshuflw(auVar84,auVar127,0xe8);
        auVar105._8_4_ = 0xffffffff;
        auVar105._0_8_ = 0xffffffffffffffff;
        auVar105._12_4_ = 0xffffffff;
        auVar105 = (auVar113 | auVar69 & auVar84) ^ auVar105;
        auVar69 = packssdw(auVar105,auVar105);
        if ((auVar69 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          puVar54[-0x780] = '\0';
        }
        auVar16._4_4_ = iVar139;
        auVar16._0_4_ = iVar139;
        auVar16._8_4_ = iVar147;
        auVar16._12_4_ = iVar147;
        auVar127 = auVar126 & auVar16 | auVar127;
        auVar69 = packssdw(auVar127,auVar127);
        auVar39._8_4_ = 0xffffffff;
        auVar39._0_8_ = 0xffffffffffffffff;
        auVar39._12_4_ = 0xffffffff;
        auVar69 = packssdw(auVar69 ^ auVar39,auVar69 ^ auVar39);
        auVar69 = packsswb(auVar69,auVar69);
        if ((auVar69._0_4_ >> 8 & 1) != 0) {
          puVar54[-0x700] = '\0';
        }
        auVar69 = auVar148 ^ auVar49;
        auVar106._0_4_ = -(uint)(iVar80 < auVar69._0_4_);
        auVar106._4_4_ = -(uint)(iVar83 < auVar69._4_4_);
        auVar106._8_4_ = -(uint)(iVar79 < auVar69._8_4_);
        auVar106._12_4_ = -(uint)(iVar82 < auVar69._12_4_);
        auVar128._4_4_ = auVar106._0_4_;
        auVar128._0_4_ = auVar106._0_4_;
        auVar128._8_4_ = auVar106._8_4_;
        auVar128._12_4_ = auVar106._8_4_;
        iVar139 = -(uint)(auVar69._4_4_ == iVar83);
        iVar147 = -(uint)(auVar69._12_4_ == iVar82);
        auVar17._4_4_ = iVar139;
        auVar17._0_4_ = iVar139;
        auVar17._8_4_ = iVar147;
        auVar17._12_4_ = iVar147;
        auVar143._4_4_ = auVar106._4_4_;
        auVar143._0_4_ = auVar106._4_4_;
        auVar143._8_4_ = auVar106._12_4_;
        auVar143._12_4_ = auVar106._12_4_;
        auVar69 = auVar17 & auVar128 | auVar143;
        auVar69 = packssdw(auVar69,auVar69);
        auVar40._8_4_ = 0xffffffff;
        auVar40._0_8_ = 0xffffffffffffffff;
        auVar40._12_4_ = 0xffffffff;
        auVar69 = packssdw(auVar69 ^ auVar40,auVar69 ^ auVar40);
        auVar69 = packsswb(auVar69,auVar69);
        if ((auVar69._0_4_ >> 0x10 & 1) != 0) {
          puVar54[-0x680] = '\0';
        }
        auVar69 = pshufhw(auVar69,auVar128,0x84);
        auVar18._4_4_ = iVar139;
        auVar18._0_4_ = iVar139;
        auVar18._8_4_ = iVar147;
        auVar18._12_4_ = iVar147;
        auVar113 = pshufhw(auVar106,auVar18,0x84);
        auVar84 = pshufhw(auVar69,auVar143,0x84);
        auVar71._8_4_ = 0xffffffff;
        auVar71._0_8_ = 0xffffffffffffffff;
        auVar71._12_4_ = 0xffffffff;
        auVar71 = (auVar84 | auVar113 & auVar69) ^ auVar71;
        auVar69 = packssdw(auVar71,auVar71);
        auVar69 = packsswb(auVar69,auVar69);
        if ((auVar69._0_4_ >> 0x18 & 1) != 0) {
          puVar54[-0x600] = '\0';
        }
        auVar69 = auVar150 ^ auVar49;
        auVar107._0_4_ = -(uint)(iVar80 < auVar69._0_4_);
        auVar107._4_4_ = -(uint)(iVar83 < auVar69._4_4_);
        auVar107._8_4_ = -(uint)(iVar79 < auVar69._8_4_);
        auVar107._12_4_ = -(uint)(iVar82 < auVar69._12_4_);
        auVar19._4_4_ = auVar107._0_4_;
        auVar19._0_4_ = auVar107._0_4_;
        auVar19._8_4_ = auVar107._8_4_;
        auVar19._12_4_ = auVar107._8_4_;
        auVar113 = pshuflw(auVar143,auVar19,0xe8);
        auVar72._0_4_ = -(uint)(auVar69._0_4_ == iVar80);
        auVar72._4_4_ = -(uint)(auVar69._4_4_ == iVar83);
        auVar72._8_4_ = -(uint)(auVar69._8_4_ == iVar79);
        auVar72._12_4_ = -(uint)(auVar69._12_4_ == iVar82);
        auVar129._4_4_ = auVar72._4_4_;
        auVar129._0_4_ = auVar72._4_4_;
        auVar129._8_4_ = auVar72._12_4_;
        auVar129._12_4_ = auVar72._12_4_;
        auVar69 = pshuflw(auVar72,auVar129,0xe8);
        auVar130._4_4_ = auVar107._4_4_;
        auVar130._0_4_ = auVar107._4_4_;
        auVar130._8_4_ = auVar107._12_4_;
        auVar130._12_4_ = auVar107._12_4_;
        auVar84 = pshuflw(auVar107,auVar130,0xe8);
        auVar41._8_4_ = 0xffffffff;
        auVar41._0_8_ = 0xffffffffffffffff;
        auVar41._12_4_ = 0xffffffff;
        auVar69 = packssdw(auVar69 & auVar113,(auVar84 | auVar69 & auVar113) ^ auVar41);
        auVar69 = packsswb(auVar69,auVar69);
        if ((auVar69 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          puVar54[-0x580] = '\0';
        }
        auVar20._4_4_ = auVar107._0_4_;
        auVar20._0_4_ = auVar107._0_4_;
        auVar20._8_4_ = auVar107._8_4_;
        auVar20._12_4_ = auVar107._8_4_;
        auVar130 = auVar129 & auVar20 | auVar130;
        auVar84 = packssdw(auVar130,auVar130);
        auVar42._8_4_ = 0xffffffff;
        auVar42._0_8_ = 0xffffffffffffffff;
        auVar42._12_4_ = 0xffffffff;
        auVar69 = packssdw(auVar69,auVar84 ^ auVar42);
        auVar69 = packsswb(auVar69,auVar69);
        if ((auVar69._4_2_ >> 8 & 1) != 0) {
          puVar54[-0x500] = '\0';
        }
        auVar69 = auVar152 ^ auVar49;
        auVar108._0_4_ = -(uint)(iVar80 < auVar69._0_4_);
        auVar108._4_4_ = -(uint)(iVar83 < auVar69._4_4_);
        auVar108._8_4_ = -(uint)(iVar79 < auVar69._8_4_);
        auVar108._12_4_ = -(uint)(iVar82 < auVar69._12_4_);
        auVar131._4_4_ = auVar108._0_4_;
        auVar131._0_4_ = auVar108._0_4_;
        auVar131._8_4_ = auVar108._8_4_;
        auVar131._12_4_ = auVar108._8_4_;
        iVar139 = -(uint)(auVar69._4_4_ == iVar83);
        iVar147 = -(uint)(auVar69._12_4_ == iVar82);
        auVar21._4_4_ = iVar139;
        auVar21._0_4_ = iVar139;
        auVar21._8_4_ = iVar147;
        auVar21._12_4_ = iVar147;
        auVar144._4_4_ = auVar108._4_4_;
        auVar144._0_4_ = auVar108._4_4_;
        auVar144._8_4_ = auVar108._12_4_;
        auVar144._12_4_ = auVar108._12_4_;
        auVar69 = auVar21 & auVar131 | auVar144;
        auVar69 = packssdw(auVar69,auVar69);
        auVar43._8_4_ = 0xffffffff;
        auVar43._0_8_ = 0xffffffffffffffff;
        auVar43._12_4_ = 0xffffffff;
        auVar69 = packssdw(auVar69 ^ auVar43,auVar69 ^ auVar43);
        auVar69 = packsswb(auVar69,auVar69);
        if ((auVar69 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          puVar54[-0x480] = '\0';
        }
        auVar69 = pshufhw(auVar69,auVar131,0x84);
        auVar22._4_4_ = iVar139;
        auVar22._0_4_ = iVar139;
        auVar22._8_4_ = iVar147;
        auVar22._12_4_ = iVar147;
        auVar113 = pshufhw(auVar108,auVar22,0x84);
        auVar84 = pshufhw(auVar69,auVar144,0x84);
        auVar73._8_4_ = 0xffffffff;
        auVar73._0_8_ = 0xffffffffffffffff;
        auVar73._12_4_ = 0xffffffff;
        auVar73 = (auVar84 | auVar113 & auVar69) ^ auVar73;
        auVar69 = packssdw(auVar73,auVar73);
        auVar69 = packsswb(auVar69,auVar69);
        if ((auVar69._6_2_ >> 8 & 1) != 0) {
          puVar54[-0x400] = '\0';
        }
        auVar69 = auVar92 ^ auVar49;
        auVar109._0_4_ = -(uint)(iVar80 < auVar69._0_4_);
        auVar109._4_4_ = -(uint)(iVar83 < auVar69._4_4_);
        auVar109._8_4_ = -(uint)(iVar79 < auVar69._8_4_);
        auVar109._12_4_ = -(uint)(iVar82 < auVar69._12_4_);
        auVar23._4_4_ = auVar109._0_4_;
        auVar23._0_4_ = auVar109._0_4_;
        auVar23._8_4_ = auVar109._8_4_;
        auVar23._12_4_ = auVar109._8_4_;
        auVar113 = pshuflw(auVar144,auVar23,0xe8);
        auVar74._0_4_ = -(uint)(auVar69._0_4_ == iVar80);
        auVar74._4_4_ = -(uint)(auVar69._4_4_ == iVar83);
        auVar74._8_4_ = -(uint)(auVar69._8_4_ == iVar79);
        auVar74._12_4_ = -(uint)(auVar69._12_4_ == iVar82);
        auVar132._4_4_ = auVar74._4_4_;
        auVar132._0_4_ = auVar74._4_4_;
        auVar132._8_4_ = auVar74._12_4_;
        auVar132._12_4_ = auVar74._12_4_;
        auVar69 = pshuflw(auVar74,auVar132,0xe8);
        auVar133._4_4_ = auVar109._4_4_;
        auVar133._0_4_ = auVar109._4_4_;
        auVar133._8_4_ = auVar109._12_4_;
        auVar133._12_4_ = auVar109._12_4_;
        auVar84 = pshuflw(auVar109,auVar133,0xe8);
        auVar110._8_4_ = 0xffffffff;
        auVar110._0_8_ = 0xffffffffffffffff;
        auVar110._12_4_ = 0xffffffff;
        auVar110 = (auVar84 | auVar69 & auVar113) ^ auVar110;
        auVar84 = packssdw(auVar110,auVar110);
        auVar69 = packsswb(auVar69 & auVar113,auVar84);
        if ((auVar69 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          puVar54[-0x380] = '\0';
        }
        auVar24._4_4_ = auVar109._0_4_;
        auVar24._0_4_ = auVar109._0_4_;
        auVar24._8_4_ = auVar109._8_4_;
        auVar24._12_4_ = auVar109._8_4_;
        auVar133 = auVar132 & auVar24 | auVar133;
        auVar84 = packssdw(auVar133,auVar133);
        auVar44._8_4_ = 0xffffffff;
        auVar44._0_8_ = 0xffffffffffffffff;
        auVar44._12_4_ = 0xffffffff;
        auVar84 = packssdw(auVar84 ^ auVar44,auVar84 ^ auVar44);
        auVar69 = packsswb(auVar69,auVar84);
        if ((auVar69._8_2_ >> 8 & 1) != 0) {
          puVar54[-0x300] = '\0';
        }
        auVar69 = auVar90 ^ auVar49;
        auVar111._0_4_ = -(uint)(iVar80 < auVar69._0_4_);
        auVar111._4_4_ = -(uint)(iVar83 < auVar69._4_4_);
        auVar111._8_4_ = -(uint)(iVar79 < auVar69._8_4_);
        auVar111._12_4_ = -(uint)(iVar82 < auVar69._12_4_);
        auVar134._4_4_ = auVar111._0_4_;
        auVar134._0_4_ = auVar111._0_4_;
        auVar134._8_4_ = auVar111._8_4_;
        auVar134._12_4_ = auVar111._8_4_;
        iVar139 = -(uint)(auVar69._4_4_ == iVar83);
        iVar147 = -(uint)(auVar69._12_4_ == iVar82);
        auVar25._4_4_ = iVar139;
        auVar25._0_4_ = iVar139;
        auVar25._8_4_ = iVar147;
        auVar25._12_4_ = iVar147;
        auVar145._4_4_ = auVar111._4_4_;
        auVar145._0_4_ = auVar111._4_4_;
        auVar145._8_4_ = auVar111._12_4_;
        auVar145._12_4_ = auVar111._12_4_;
        auVar69 = auVar25 & auVar134 | auVar145;
        auVar69 = packssdw(auVar69,auVar69);
        auVar45._8_4_ = 0xffffffff;
        auVar45._0_8_ = 0xffffffffffffffff;
        auVar45._12_4_ = 0xffffffff;
        auVar69 = packssdw(auVar69 ^ auVar45,auVar69 ^ auVar45);
        auVar69 = packsswb(auVar69,auVar69);
        if ((auVar69 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          puVar54[-0x280] = '\0';
        }
        auVar69 = pshufhw(auVar69,auVar134,0x84);
        auVar26._4_4_ = iVar139;
        auVar26._0_4_ = iVar139;
        auVar26._8_4_ = iVar147;
        auVar26._12_4_ = iVar147;
        auVar113 = pshufhw(auVar111,auVar26,0x84);
        auVar84 = pshufhw(auVar69,auVar145,0x84);
        auVar75._8_4_ = 0xffffffff;
        auVar75._0_8_ = 0xffffffffffffffff;
        auVar75._12_4_ = 0xffffffff;
        auVar75 = (auVar84 | auVar113 & auVar69) ^ auVar75;
        auVar69 = packssdw(auVar75,auVar75);
        auVar69 = packsswb(auVar69,auVar69);
        if ((auVar69._10_2_ >> 8 & 1) != 0) {
          puVar54[-0x200] = '\0';
        }
        auVar69 = auVar87 ^ auVar49;
        auVar112._0_4_ = -(uint)(iVar80 < auVar69._0_4_);
        auVar112._4_4_ = -(uint)(iVar83 < auVar69._4_4_);
        auVar112._8_4_ = -(uint)(iVar79 < auVar69._8_4_);
        auVar112._12_4_ = -(uint)(iVar82 < auVar69._12_4_);
        auVar27._4_4_ = auVar112._0_4_;
        auVar27._0_4_ = auVar112._0_4_;
        auVar27._8_4_ = auVar112._8_4_;
        auVar27._12_4_ = auVar112._8_4_;
        auVar113 = pshuflw(auVar145,auVar27,0xe8);
        auVar76._0_4_ = -(uint)(auVar69._0_4_ == iVar80);
        auVar76._4_4_ = -(uint)(auVar69._4_4_ == iVar83);
        auVar76._8_4_ = -(uint)(auVar69._8_4_ == iVar79);
        auVar76._12_4_ = -(uint)(auVar69._12_4_ == iVar82);
        auVar135._4_4_ = auVar76._4_4_;
        auVar135._0_4_ = auVar76._4_4_;
        auVar135._8_4_ = auVar76._12_4_;
        auVar135._12_4_ = auVar76._12_4_;
        auVar69 = pshuflw(auVar76,auVar135,0xe8);
        auVar136._4_4_ = auVar112._4_4_;
        auVar136._0_4_ = auVar112._4_4_;
        auVar136._8_4_ = auVar112._12_4_;
        auVar136._12_4_ = auVar112._12_4_;
        auVar84 = pshuflw(auVar112,auVar136,0xe8);
        auVar46._8_4_ = 0xffffffff;
        auVar46._0_8_ = 0xffffffffffffffff;
        auVar46._12_4_ = 0xffffffff;
        auVar69 = packssdw(auVar69 & auVar113,(auVar84 | auVar69 & auVar113) ^ auVar46);
        auVar69 = packsswb(auVar69,auVar69);
        if ((auVar69 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          puVar54[-0x180] = '\0';
        }
        auVar28._4_4_ = auVar112._0_4_;
        auVar28._0_4_ = auVar112._0_4_;
        auVar28._8_4_ = auVar112._8_4_;
        auVar28._12_4_ = auVar112._8_4_;
        auVar136 = auVar135 & auVar28 | auVar136;
        auVar84 = packssdw(auVar136,auVar136);
        auVar47._8_4_ = 0xffffffff;
        auVar47._0_8_ = 0xffffffffffffffff;
        auVar47._12_4_ = 0xffffffff;
        auVar69 = packssdw(auVar69,auVar84 ^ auVar47);
        auVar69 = packsswb(auVar69,auVar69);
        if ((auVar69._12_2_ >> 8 & 1) != 0) {
          puVar54[-0x100] = '\0';
        }
        auVar69 = auVar58 ^ auVar49;
        in_XMM7._0_4_ = -(uint)(iVar80 < auVar69._0_4_);
        in_XMM7._4_4_ = -(uint)(iVar83 < auVar69._4_4_);
        in_XMM7._8_4_ = -(uint)(iVar79 < auVar69._8_4_);
        in_XMM7._12_4_ = -(uint)(iVar82 < auVar69._12_4_);
        auVar137._4_4_ = in_XMM7._0_4_;
        auVar137._0_4_ = in_XMM7._0_4_;
        auVar137._8_4_ = in_XMM7._8_4_;
        auVar137._12_4_ = in_XMM7._8_4_;
        iVar80 = -(uint)(auVar69._4_4_ == iVar83);
        iVar83 = -(uint)(auVar69._12_4_ == iVar82);
        auVar86._4_4_ = iVar80;
        auVar86._0_4_ = iVar80;
        auVar86._8_4_ = iVar83;
        auVar86._12_4_ = iVar83;
        auVar77._4_4_ = in_XMM7._4_4_;
        auVar77._0_4_ = in_XMM7._4_4_;
        auVar77._8_4_ = in_XMM7._12_4_;
        auVar77._12_4_ = in_XMM7._12_4_;
        auVar77 = auVar86 & auVar137 | auVar77;
        auVar69 = packssdw(auVar77,auVar77);
        auVar48._8_4_ = 0xffffffff;
        auVar48._0_8_ = 0xffffffffffffffff;
        auVar48._12_4_ = 0xffffffff;
        auVar69 = packssdw(auVar69 ^ auVar48,auVar69 ^ auVar48);
        auVar69 = packsswb(auVar69,auVar69);
        if ((auVar69 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          puVar54[-0x80] = '\0';
        }
        auVar69 = pshufhw(auVar69,auVar137,0x84);
        auVar113 = pshufhw(auVar86,auVar86,0x84);
        auVar29._4_4_ = in_XMM7._4_4_;
        auVar29._0_4_ = in_XMM7._4_4_;
        auVar29._8_4_ = in_XMM7._12_4_;
        auVar29._12_4_ = in_XMM7._12_4_;
        auVar84 = pshufhw(auVar69,auVar29,0x84);
        auVar78._8_4_ = 0xffffffff;
        auVar78._0_8_ = 0xffffffffffffffff;
        auVar78._12_4_ = 0xffffffff;
        auVar78 = (auVar84 | auVar113 & auVar69) ^ auVar78;
        auVar69 = packssdw(auVar78,auVar78);
        auVar69 = packsswb(auVar69,auVar69);
        if ((auVar69._14_2_ >> 8 & 1) != 0) {
          *puVar54 = '\0';
        }
        auVar149._0_8_ = auVar94._0_8_ + 0x10;
        auVar149._8_8_ = auVar94._8_8_ + 0x10;
        auVar151._0_8_ = auVar148._0_8_ + 0x10;
        auVar151._8_8_ = auVar148._8_8_ + 0x10;
        auVar153._0_8_ = auVar150._0_8_ + 0x10;
        auVar153._8_8_ = auVar150._8_8_ + 0x10;
        auVar154._0_8_ = auVar152._0_8_ + 0x10;
        auVar154._8_8_ = auVar152._8_8_ + 0x10;
        auVar95._0_8_ = auVar92._0_8_ + 0x10;
        auVar95._8_8_ = auVar92._8_8_ + 0x10;
        auVar93._0_8_ = auVar90._0_8_ + 0x10;
        auVar93._8_8_ = auVar90._8_8_ + 0x10;
        auVar91._0_8_ = auVar87._0_8_ + 0x10;
        auVar91._8_8_ = auVar87._8_8_ + 0x10;
        auVar88._0_8_ = auVar58._0_8_ + 0x10;
        auVar88._8_8_ = auVar58._8_8_ + 0x10;
        uVar52 = uVar52 - 0x10;
        puVar54 = puVar54 + 0x800;
        auVar58 = auVar88;
        auVar87 = auVar91;
        auVar90 = auVar93;
        auVar92 = auVar95;
        auVar94 = auVar149;
        auVar148 = auVar151;
        auVar150 = auVar153;
        auVar152 = auVar154;
      } while (uVar52 != 0);
    }
    lVar55 = lVar55 + 1;
    puVar53 = puVar53 + 1;
  } while (lVar55 != 0x7a);
  pcVar57 = display_string_list_buffer;
  iVar80 = 5;
  do {
    cVar1 = *pcVar57;
    if (cVar1 == '\n') {
      y = y + 6;
      iVar80 = 5;
    }
    else {
      if (cVar1 == '\0') {
        return y;
      }
      drawChar(iVar80,y,(int)cVar1);
      iVar80 = iVar80 + 4;
    }
    pcVar57 = pcVar57 + 1;
  } while( true );
}

Assistant:

static int drawDisplayStringList()
{
    drawMap();
    int w = 30 * 4;
    int x = 5;
    int sx = x;
    int y = (DISPLAY_HEIGHT-display_string_list_line_count*6) / 2;
    fillBox(x - 2, y - 2, w + 4, display_string_list_line_count * 6 + 5, 255);
    fillBox(x - 1, y - 1, w + 2, display_string_list_line_count * 6 + 2, 0);
    for(char* c=display_string_list_buffer; *c; c++)
    {
        if (*c == '\n')
        {
            x = sx;
            y += 6;
        }else{
            drawChar(x, y, *c);
            x+=4;
        }
    }
    return y;
}